

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.cc
# Opt level: O0

void __thiscall
testing::Matcher<const_std::basic_string_view<char,_std::char_traits<char>_>_&>::Matcher
          (Matcher<const_std::basic_string_view<char,_std::char_traits<char>_>_&> *this,StringView s
          )

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  MatcherBase<const_std::basic_string_view<char,_std::char_traits<char>_>_&>
  *in_stack_ffffffffffffff70;
  allocator<char> *this_00;
  allocator<char> local_71;
  string local_70 [16];
  allocator<char> *in_stack_ffffffffffffffa0;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffffa8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  
  internal::MatcherBase<const_std::basic_string_view<char,_std::char_traits<char>_>_&>::MatcherBase
            (in_stack_ffffffffffffff70);
  *(undefined ***)in_RDI = &PTR__Matcher_001aa4e8;
  this_00 = &local_71;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  Eq<std::__cxx11::string>(in_RDI);
  Matcher<std::basic_string_view<char,std::char_traits<char>>const&>::
  Matcher<testing::internal::EqMatcher<std::__cxx11::string>,void>
            ((Matcher<const_std::basic_string_view<char,_std::char_traits<char>_>_&> *)this_00,
             (EqMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)in_RDI);
  operator=((Matcher<const_std::basic_string_view<char,_std::char_traits<char>_>_&> *)this_00,
            (Matcher<const_std::basic_string_view<char,_std::char_traits<char>_>_&> *)in_RDI);
  ~Matcher((Matcher<const_std::basic_string_view<char,_std::char_traits<char>_>_&> *)0x128e22);
  internal::
  EqMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~EqMatcher((EqMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x128e2c);
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator(&local_71);
  return;
}

Assistant:

Matcher<const internal::StringView&>::Matcher(internal::StringView s) {
  *this = Eq(std::string(s));
}